

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

idx_t duckdb::TemplatedUpdateNumericStatistics<double>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  
  pdVar1 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      uVar6 = 0;
      do {
        psVar2 = update->sel->sel_vector;
        uVar4 = uVar6;
        if (psVar2 != (sel_t *)0x0) {
          uVar4 = (ulong)psVar2[uVar6];
        }
        BaseStatistics::UpdateNumericStats<double>
                  (&stats->statistics,*(double *)(pdVar1 + uVar4 * 8));
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
    this = (sel->selection_data).internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    sel->sel_vector = (sel_t *)0x0;
    iVar5 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    if (count == 0) {
      iVar5 = 0;
    }
    else {
      uVar6 = 0;
      iVar5 = 0;
      do {
        psVar2 = update->sel->sel_vector;
        uVar4 = uVar6;
        if (psVar2 != (sel_t *)0x0) {
          uVar4 = (ulong)psVar2[uVar6];
        }
        puVar3 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)) {
          sel->sel_vector[iVar5] = (sel_t)uVar6;
          iVar5 = iVar5 + 1;
          BaseStatistics::UpdateNumericStats<double>
                    (&stats->statistics,*(double *)(pdVar1 + uVar4 * 8));
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
  }
  return iVar5;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}